

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavaOPL3.hpp
# Opt level: O1

void __thiscall ADL_JavaOPL3::OPL3::updateChannelPans(OPL3 *this)

{
  Channel *pCVar1;
  Channel *(*papCVar2) [9];
  long lVar3;
  int i;
  long lVar4;
  bool bVar5;
  double dVar6;
  
  papCVar2 = this->channels;
  lVar3 = 0;
  do {
    lVar4 = 0;
    do {
      this->registers[(long)(*papCVar2)[lVar4]->channelBaseAddress + 0xc0] =
           this->registers[(long)(*papCVar2)[lVar4]->channelBaseAddress + 0xc0] | 0xf0;
      if (this->FullPan == false) {
        pCVar1 = (*papCVar2)[lVar4];
        if (this->_new == 0) {
          pCVar1->leftPan = 0.3333;
          dVar6 = 0.3333;
        }
        else {
          pCVar1->leftPan = (double)pCVar1->cha * 0.3333;
          dVar6 = (double)pCVar1->chb * 0.3333;
        }
        pCVar1->rightPan = dVar6;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != 9);
    papCVar2 = papCVar2 + 1;
    bVar5 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar5);
  return;
}

Assistant:

void OPL3::updateChannelPans() {
    for(int array=0; array<2; array++)
        for(int i=0; i<9; i++) {
            int baseAddress = channels[array][i]->channelBaseAddress;
			registers[baseAddress+ChannelData::CHD1_CHC1_CHB1_CHA1_FB3_CNT1_Offset] |= 0xF0;
            channels[array][i]->updatePan(this);
        }

}